

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChQuadrature.h
# Opt level: O1

void __thiscall chrono::ChQuadratureTables::~ChQuadratureTables(ChQuadratureTables *this)

{
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&this->Lroots);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&this->Weight);
  return;
}

Assistant:

class ChApi ChQuadratureTables {
  public:
    ChQuadratureTables(int order_from = 1, int order_to = 10);

    std::vector<std::vector<double> > Weight;
    std::vector<std::vector<double> > Lroots;

    void PrintTables();

  private:
    void glege_roots(ChMatrixDynamic<>& lcoef, int N, int ntable);
}